

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         GeneratedClassFileName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  AlphaNum *pAVar1;
  AlphaNum *b;
  char *pcVar2;
  undefined1 *puVar3;
  AlphaNum local_b8;
  AlphaNum local_88;
  int local_44;
  undefined1 local_40 [4];
  int i;
  string result;
  Options *options_local;
  EnumDescriptor *desc_local;
  
  result.field_2._8_8_ = options;
  FullClassName<google::protobuf::EnumDescriptor>((string *)local_40,desc,options);
  local_44 = 0;
  while( true ) {
    pAVar1 = (AlphaNum *)(long)local_44;
    b = (AlphaNum *)std::__cxx11::string::size();
    if (b <= pAVar1) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar2 == '\\') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar3 = 0x2f;
    }
    local_44 = local_44 + 1;
  }
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
            );
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b8,".php");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_88,&local_b8,b);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassFileName(const DescriptorType* desc,
                                   const Options& options) {
  std::string result = FullClassName(desc, options);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '\\') {
      result[i] = '/';
    }
  }
  return absl::StrCat(result, ".php");
}